

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Http.cpp
# Opt level: O2

String * asl::Url::params(String *__return_storage_ptr__,Dic<asl::String> *q)

{
  KeyVal *pKVar1;
  KeyVal *pKVar2;
  String *this;
  long lVar3;
  uint uVar4;
  bool bVar5;
  Dic<asl::String> d;
  String local_60;
  String local_48;
  
  Array<asl::Map<asl::String,_asl::String>::KeyVal>::Array
            ((Array<asl::Map<asl::String,_asl::String>::KeyVal> *)&d);
  uVar4 = 1;
  for (lVar3 = 0;
      (uVar4 != 0 &&
      (pKVar1 = (q->super_Map<asl::String,_asl::String>).a._a,
      lVar3 < *(int *)&pKVar1[-1].value.field_2)); lVar3 = lVar3 + 1) {
    while (0 < (int)uVar4) {
      pKVar2 = (q->super_Map<asl::String,_asl::String>).a._a;
      while (bVar5 = uVar4 != 0, uVar4 = uVar4 - 1, bVar5) {
        encode(&local_48,&pKVar1[lVar3].value,true);
        encode(&local_60,&pKVar2[lVar3].key,true);
        this = Map<asl::String,_asl::String>::operator[]
                         (&d.super_Map<asl::String,_asl::String>,&local_60);
        String::operator=(this,&local_48);
        String::~String(&local_60);
        String::~String(&local_48);
      }
      uVar4 = 0xfffffffe;
    }
    uVar4 = ~uVar4;
  }
  String::String(&local_48,'&');
  String::String(&local_60,'=');
  Map<asl::String,_asl::String>::join
            (__return_storage_ptr__,&d.super_Map<asl::String,_asl::String>,&local_48,&local_60);
  String::~String(&local_60);
  String::~String(&local_48);
  Array<asl::Map<asl::String,_asl::String>::KeyVal>::~Array
            ((Array<asl::Map<asl::String,_asl::String>::KeyVal> *)&d);
  return __return_storage_ptr__;
}

Assistant:

String Url::params(const Dic<>& q)
{
	Dic<> d;
	foreach2(String& k, const String& v, q)
		d[Url::encode(k, true)] = Url::encode(v, true);
	return d.join('&', '=');
}